

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O2

void __thiscall async_unit_test::async_unit_test(async_unit_test *this,service *s)

{
  url_dispatcher *puVar1;
  allocator local_31;
  string local_30;
  
  cppcms::application::application(&this->super_application,s);
  *(undefined ***)this = &PTR__application_0010d940;
  puVar1 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_30,"/single",&local_31);
  cppcms::url_dispatcher::assign<async_unit_test>(puVar1,&local_30,0x108b7a,(async_unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  puVar1 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_30,"/multiple",&local_31);
  cppcms::url_dispatcher::assign<async_unit_test>(puVar1,&local_30,0x108c26,(async_unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

async_unit_test(cppcms::service &s) : cppcms::application(s)
	{
		dispatcher().assign("/single",&async_unit_test::single,this);
		dispatcher().assign("/multiple",&async_unit_test::multiple,this);
	}